

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

Vector3d * __thiscall
VCClusterAniso::center
          (Vector3d *__return_storage_ptr__,VCClusterAniso *this,Matrix3d *sumK,Vector3d *sumKPos)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  
  dVar1 = (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[5];
  dVar2 = (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[6];
  dVar7 = (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[3];
  dVar8 = (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[4];
  dVar9 = (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[0];
  dVar10 = (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[1];
  dVar11 = (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[7];
  dVar12 = (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[8];
  dVar13 = dVar12 * (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array[4] - dVar1 * dVar11;
  dVar14 = dVar2 * (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                   m_data.array[5] - dVar7 * dVar12;
  dVar15 = dVar7 * dVar11 - dVar8 * dVar2;
  dVar3 = (sumK->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
          array[2];
  dVar16 = dVar14 * dVar10 + dVar15 * dVar3 + dVar13 * dVar9;
  if (ABS(dVar16) <= 1e-12) {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[0] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[1] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[2] = 0.0;
    return __return_storage_ptr__;
  }
  dVar16 = 1.0 / dVar16;
  dVar4 = (sumKPos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[0];
  dVar5 = (sumKPos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[1];
  dVar6 = (sumKPos->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[2];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = dVar15 * dVar16 * dVar6 + dVar14 * dVar16 * dVar5 + dVar13 * dVar16 * dVar4;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] =
       (dVar2 * dVar10 - dVar11 * dVar9) * dVar16 * dVar6 +
       (dVar12 * dVar9 - dVar2 * dVar3) * dVar16 * dVar5 +
       (dVar11 * dVar3 - dVar12 * dVar10) * dVar16 * dVar4;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] =
       (dVar9 * dVar8 - dVar7 * dVar10) * dVar16 * dVar6 +
       (dVar3 * dVar7 - dVar1 * dVar9) * dVar16 * dVar5 +
       (dVar10 * dVar1 - dVar8 * dVar3) * dVar16 * dVar4;
  return __return_storage_ptr__;
}

Assistant:

Vector3d VCClusterAniso::center(const Matrix3d& sumK, const Vector3d &sumKPos)
{
	bool valid;
	Matrix3d sumKInv;
	double det;
	sumK.computeInverseAndDetWithCheck(sumKInv, det, valid);
	if (!valid) {
		return Vector3d(0, 0, 0);
	}
	return sumKInv * sumKPos;
}